

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets_tests.cpp
# Opt level: O2

void AddMulti(TimeOffsets *offsets,
             vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *to_add)

{
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pdVar2 = (to_add->
           super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pdVar3 = (to_add->
                super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pdVar3 != pdVar2; pdVar3 = pdVar3 + 1) {
    TimeOffsets::Add(offsets,(seconds)pdVar3->__r);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void AddMulti(TimeOffsets& offsets, const std::vector<std::chrono::seconds>& to_add)
{
    for (auto offset : to_add) {
        offsets.Add(offset);
    }
}